

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImagePool::~CVmImagePool(CVmImagePool *this)

{
  ulong uVar1;
  ulong uVar2;
  
  (this->super_CVmPoolBackingStore)._vptr_CVmPoolBackingStore =
       (_func_int **)&PTR__CVmImagePool_0035f3a0;
  if (this->page_info_ != (CVmImagePool_pg **)0x0) {
    uVar1 = this->page_count_;
    for (uVar2 = 0; uVar1 + 0xfff >> 0xc != uVar2; uVar2 = uVar2 + 1) {
      free(this->page_info_[uVar2]);
    }
    free(this->page_info_);
    return;
  }
  return;
}

Assistant:

CVmImagePool::~CVmImagePool()
{
    /* if we allocated a set of page offset arrays, delete them */
    if (page_info_ != 0)
    {
        size_t i;
        size_t cnt;

        /* compute the number of subarrays we have */
        cnt = get_subarray_count();

        /* delete each subarray */
        for (i = 0 ; i < cnt ; ++i)
            t3free(page_info_[i]);

        /* delete the master array */
        t3free(page_info_);
    }
}